

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O0

int KINBBDPrecInit(void *kinmem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,sunrealtype dq_rel_uu,KINBBDLocalFn gloc,
                  KINBBDCommFn gcomm)

{
  int iVar1;
  SUNContext_conflict sunctx;
  SUNMatrix p_Var2;
  N_Vector p_Var3;
  long lVar4;
  SUNLinearSolver p_Var5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  KINMem in_RDI;
  sunindextype in_R8;
  SUNContext_conflict in_R9;
  double in_XMM0_Qa;
  long in_stack_00000008;
  long in_stack_00000010;
  int flag;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype storage_mu;
  sunindextype mlk;
  sunindextype muk;
  KBBDPrecData pdata;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  double local_130;
  SUNContext_conflict in_stack_fffffffffffffed8;
  SUNContext_conflict in_stack_fffffffffffffee8;
  SUNContext_conflict sunctx_00;
  SUNContext_conflict kinmem_00;
  sunindextype in_stack_ffffffffffffff08;
  long local_e8;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  SUNContext_conflict local_70;
  SUNContext_conflict local_68;
  sunindextype local_60;
  long *local_58;
  void *pvVar6;
  KINMem kin_mem_00;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x48,"KINBBDPrecInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,"KINSOL Memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->kin_lmem == (void *)0x0) {
    KINProcessError(in_RDI,-2,0x51,"KINBBDPrecInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                    ,
                    "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                   );
    local_4 = -2;
  }
  else {
    pvVar6 = in_RDI->kin_lmem;
    if (in_RDI->kin_vtemp1->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0) {
      KINProcessError(in_RDI,-3,0x5b,"KINBBDPrecInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      local_58 = (long *)0x0;
      kin_mem_00 = in_RDI;
      local_58 = (long *)malloc(0x98);
      if (local_58 == (long *)0x0) {
        KINProcessError(kin_mem_00,-4,0x65,"KINBBDPrecInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                        ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        local_58[0x12] = (long)in_RDI;
        local_58[5] = in_stack_00000008;
        local_58[6] = in_stack_00000010;
        local_a8 = in_RDX;
        if (in_RDX < 0) {
          local_a8 = 0;
        }
        if (in_RSI + -1 < local_a8) {
          local_b0 = in_RSI + -1;
        }
        else {
          local_b8 = in_RDX;
          if (in_RDX < 0) {
            local_b8 = 0;
          }
          local_b0 = local_b8;
        }
        *local_58 = local_b0;
        local_c8 = in_RCX;
        if (in_RCX < 0) {
          local_c8 = 0;
        }
        if (in_RSI + -1 < local_c8) {
          local_d0 = in_RSI + -1;
        }
        else {
          local_d8 = in_RCX;
          if (in_RCX < 0) {
            local_d8 = 0;
          }
          local_d0 = local_d8;
        }
        local_58[1] = local_d0;
        local_e8 = in_R8;
        if (in_R8 < 0) {
          local_e8 = 0;
        }
        if (in_RSI + -1 < local_e8) {
          in_R8 = in_stack_ffffffffffffff08;
          local_60 = in_RSI + -1;
        }
        else {
          local_60 = in_R8;
          if (in_R8 < 0) {
            in_R8 = 0;
            local_60 = in_R8;
          }
        }
        kinmem_00 = in_R9;
        if ((long)in_R9 < 0) {
          kinmem_00 = (SUNContext_conflict)0x0;
        }
        if (in_RSI + -1 < (long)kinmem_00) {
          in_R9 = in_stack_fffffffffffffee8;
          sunctx_00 = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          sunctx_00 = in_R9;
          if ((long)in_R9 < 0) {
            in_R9 = (SUNContext_conflict)0x0;
            sunctx_00 = in_R9;
          }
        }
        local_58[2] = local_60;
        local_58[3] = (long)sunctx_00;
        if (in_RSI + -1 < (long)&sunctx_00->profiler + local_60) {
          sunctx = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          sunctx = (SUNContext_conflict)((long)&sunctx_00->profiler + local_60);
        }
        local_58[8] = 0;
        local_70 = sunctx;
        local_68 = sunctx_00;
        p_Var2 = SUNBandMatrixStorage(local_60,in_R8,in_RSI + -1,(sunindextype)kinmem_00,sunctx_00);
        local_58[8] = (long)p_Var2;
        if (local_58[8] == 0) {
          free(local_58);
          local_58 = (long *)0x0;
          KINProcessError(kin_mem_00,-4,0x80,"KINBBDPrecInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                          ,"A memory request failed.");
          local_4 = -4;
        }
        else {
          local_58[0xb] = 0;
          p_Var3 = N_VNew_Serial((sunindextype)sunctx,in_stack_fffffffffffffed8);
          local_58[0xb] = (long)p_Var3;
          if (local_58[0xb] == 0) {
            SUNMatDestroy(local_58[8]);
            free(local_58);
            local_58 = (long *)0x0;
            KINProcessError(kin_mem_00,-4,0x8d,"KINBBDPrecInit",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                            ,"A memory request failed.");
            local_4 = -4;
          }
          else {
            local_58[10] = 0;
            p_Var3 = N_VNewEmpty_Serial((sunindextype)sunctx,in_stack_fffffffffffffed8);
            local_58[10] = (long)p_Var3;
            if (local_58[10] == 0) {
              N_VDestroy(local_58[0xb]);
              SUNMatDestroy(local_58[8]);
              free(local_58);
              local_58 = (long *)0x0;
              KINProcessError(kin_mem_00,-4,0x9a,"KINBBDPrecInit",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                              ,"A memory request failed.");
              local_4 = -4;
            }
            else {
              local_58[0xc] = 0;
              lVar4 = N_VClone(kin_mem_00->kin_vtemp1);
              local_58[0xc] = lVar4;
              if (local_58[0xc] == 0) {
                N_VDestroy(local_58[0xb]);
                N_VDestroy(local_58[10]);
                SUNMatDestroy(local_58[8]);
                free(local_58);
                local_58 = (long *)0x0;
                KINProcessError(kin_mem_00,-4,0xa8,"KINBBDPrecInit",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                                ,"A memory request failed.");
                local_4 = -4;
              }
              else {
                local_58[0xd] = 0;
                lVar4 = N_VClone(kin_mem_00->kin_vtemp1);
                local_58[0xd] = lVar4;
                if (local_58[0xd] == 0) {
                  N_VDestroy(local_58[0xb]);
                  N_VDestroy(local_58[10]);
                  N_VDestroy(local_58[0xc]);
                  SUNMatDestroy(local_58[8]);
                  free(local_58);
                  local_58 = (long *)0x0;
                  KINProcessError(kin_mem_00,-4,0xb7,"KINBBDPrecInit",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                                  ,"A memory request failed.");
                  local_4 = -4;
                }
                else {
                  local_58[0xe] = 0;
                  lVar4 = N_VClone(kin_mem_00->kin_vtemp1);
                  local_58[0xe] = lVar4;
                  if (local_58[0xe] == 0) {
                    N_VDestroy(local_58[0xb]);
                    N_VDestroy(local_58[10]);
                    N_VDestroy(local_58[0xc]);
                    N_VDestroy(local_58[0xd]);
                    SUNMatDestroy(local_58[8]);
                    free(local_58);
                    local_58 = (long *)0x0;
                    KINProcessError(kin_mem_00,-4,199,"KINBBDPrecInit",
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                                    ,"A memory request failed.");
                    local_4 = -4;
                  }
                  else {
                    local_58[9] = 0;
                    p_Var5 = SUNLinSol_Band((N_Vector)sunctx_00,(SUNMatrix)in_R9,sunctx);
                    local_58[9] = (long)p_Var5;
                    if (local_58[9] == 0) {
                      N_VDestroy(local_58[0xb]);
                      N_VDestroy(local_58[10]);
                      N_VDestroy(local_58[0xc]);
                      N_VDestroy(local_58[0xd]);
                      N_VDestroy(local_58[0xe]);
                      SUNMatDestroy(local_58[8]);
                      free(local_58);
                      local_58 = (long *)0x0;
                      KINProcessError(kin_mem_00,-4,0xd9,"KINBBDPrecInit",
                                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                                      ,"A memory request failed.");
                      local_4 = -4;
                    }
                    else {
                      local_130 = in_XMM0_Qa;
                      iVar1 = SUNLinSolInitialize(local_58[9]);
                      if (iVar1 == 0) {
                        if (local_130 <= 0.0) {
                          if (0.0 < kin_mem_00->kin_uround) {
                            local_130 = sqrt(kin_mem_00->kin_uround);
                          }
                          else {
                            local_130 = 0.0;
                          }
                        }
                        local_58[4] = (long)local_130;
                        local_58[7] = in_RSI;
                        local_58[0xf] = 0;
                        local_58[0x10] = 0;
                        if (kin_mem_00->kin_vtemp1->ops->nvspace !=
                            (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                          N_VSpace(kin_mem_00->kin_vtemp1,&local_78,&local_80);
                          local_58[0xf] = local_78 * 3 + local_58[0xf];
                          local_58[0x10] = local_80 * 3 + local_58[0x10];
                        }
                        if (*(long *)(*(long *)(local_58[0xb] + 8) + 0x20) != 0) {
                          N_VSpace(local_58[0xb],&local_78,&local_80);
                          local_58[0xf] = local_78 + local_58[0xf];
                          local_58[0x10] = local_80 + local_58[0x10];
                        }
                        if (*(long *)(*(long *)(local_58[10] + 8) + 0x20) != 0) {
                          N_VSpace(local_58[10],&local_78,&local_80);
                          local_58[0xf] = local_78 + local_58[0xf];
                          local_58[0x10] = local_80 + local_58[0x10];
                        }
                        if (*(long *)(*(long *)(local_58[8] + 8) + 0x50) != 0) {
                          SUNMatSpace(local_58[8],&local_88,&local_90);
                          local_58[0xf] = local_88 + local_58[0xf];
                          local_58[0x10] = local_90 + local_58[0x10];
                        }
                        if (*(long *)(*(long *)(local_58[9] + 8) + 0x60) != 0) {
                          SUNLinSolSpace(local_58[9],&local_88,&local_90);
                          local_58[0xf] = local_88 + local_58[0xf];
                          local_58[0x10] = local_90 + local_58[0x10];
                        }
                        local_58[0x11] = 0;
                        if (*(long *)((long)pvVar6 + 0x88) != 0) {
                          (**(code **)((long)pvVar6 + 0x88))(kin_mem_00);
                        }
                        *(long **)((long)pvVar6 + 0x90) = local_58;
                        *(code **)((long)pvVar6 + 0x88) = KINBBDPrecFree;
                        local_4 = KINSetPreconditioner
                                            (kinmem_00,(KINLsPrecSetupFn)sunctx_00,
                                             (KINLsPrecSolveFn)in_R9);
                      }
                      else {
                        N_VDestroy(local_58[0xb]);
                        N_VDestroy(local_58[10]);
                        N_VDestroy(local_58[0xc]);
                        N_VDestroy(local_58[0xd]);
                        N_VDestroy(local_58[0xe]);
                        SUNMatDestroy(local_58[8]);
                        SUNLinSolFree(local_58[9]);
                        free(local_58);
                        local_58 = (long *)0x0;
                        KINProcessError(kin_mem_00,-8,0xeb,"KINBBDPrecInit",
                                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_bbdpre.c"
                                        ,"An error arose from a SUNBandLinearSolver routine.");
                        local_4 = -8;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int KINBBDPrecInit(void* kinmem, sunindextype Nlocal, sunindextype mudq,
                   sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                   sunrealtype dq_rel_uu, KINBBDLocalFn gloc, KINBBDCommFn gcomm)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_NULL);
    return (KINLS_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  /* Test if the LS linear solver interface has been created */
  if (kin_mem->kin_lmem == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSGBBD_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  /* Note: Do NOT need to check for N_VScale since has already been checked for in KINSOL */
  if (kin_mem->kin_vtemp1->ops->nvgetarraypointer == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGBBD_BAD_NVECTOR);
    return (KINLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (KBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* Set pointers to gloc and gcomm; load half-bandwidths */
  pdata->kin_mem = kinmem;
  pdata->gloc    = gloc;
  pdata->gcomm   = gcomm;
  pdata->mudq    = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq    = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk            = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk            = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep  = muk;
  pdata->mlkeep  = mlk;

  /* Set extended upper half-bandwidth for PP (required for pivoting) */
  storage_mu = SUNMIN(Nlocal - 1, muk + mlk);

  /* Allocate memory for preconditioner matrix */
  pdata->PP = NULL;
  pdata->PP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                   kin_mem->kin_sunctx);
  if (pdata->PP == NULL)
  {
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNew_Serial(Nlocal, kin_mem->kin_sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, kin_mem->kin_sunctx); /* empty vector */
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->tempv1 = NULL;
  pdata->tempv1 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv1 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->tempv2 = NULL;
  pdata->tempv2 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv2 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  pdata->tempv3 = NULL;
  pdata->tempv3 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv3 == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->zlocal, pdata->PP, kin_mem->kin_sunctx);
  if (pdata->LS == NULL)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNLS_FAIL);
    return (KINLS_SUNLS_FAIL);
  }

  /* Set rel_uu based on input value dq_rel_uu (0 implies default) */
  pdata->rel_uu = (dq_rel_uu > ZERO) ? dq_rel_uu : SUNRsqrt(kin_mem->kin_uround);

  /* Store Nlocal to be used in KINBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (kin_mem->kin_vtemp1->ops->nvspace)
  {
    N_VSpace(kin_mem->kin_vtemp1, &lrw1, &liw1);
    pdata->rpwsize += 3 * lrw1;
    pdata->ipwsize += 3 * liw1;
  }
  if (pdata->zlocal->ops->nvspace)
  {
    N_VSpace(pdata->zlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->PP->ops->space)
  {
    flag = SUNMatSpace(pdata->PP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure pdata is free from any previous allocations */
  if (kinls_mem->pfree != NULL) { kinls_mem->pfree(kin_mem); }

  /* Point to the new pdata field in the LS memory */
  kinls_mem->pdata = pdata;

  /* Attach the pfree function */
  kinls_mem->pfree = KINBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = KINSetPreconditioner(kinmem, KINBBDPrecSetup, KINBBDPrecSolve);

  return (flag);
}